

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O0

bool __thiscall Js::ByteCodeWriter::DoProfileNewScArrayOp(ByteCodeWriter *this,OpCode op)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  bool local_25;
  bool local_13;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uVar2 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,NativeArrayPhase,uVar2,LVar3);
  local_13 = false;
  if (!bVar1) {
    uVar2 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
    LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,NativeNewScArrayPhase,uVar2,LVar3);
    local_13 = false;
    if (!bVar1) {
      bVar1 = FunctionProxy::IsInDebugMode((FunctionProxy *)this->m_functionWrite);
      local_13 = false;
      if (!bVar1) {
        local_25 = true;
        if ((op != NewScIntArray) && (local_25 = true, op != NewScFltArray)) {
          local_25 = op == NewScArray;
        }
        local_13 = local_25;
      }
    }
  }
  return local_13;
}

Assistant:

bool DoProfileNewScArrayOp(OpCode op)
        {
            return
                !PHASE_OFF(NativeArrayPhase, m_functionWrite) &&
                !PHASE_OFF(NativeNewScArrayPhase, m_functionWrite) &&
                !m_functionWrite->IsInDebugMode() &&
                (op == OpCode::NewScIntArray || op == OpCode::NewScFltArray || op == OpCode::NewScArray);
        }